

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O1

bool __thiscall Selector::callListeners(Selector *this,int fd,uint32_t events)

{
  ListenerNode *pLVar1;
  SelectorListener *pSVar2;
  jh_ptr_int_t jVar3;
  bool bVar4;
  iterator listener;
  AutoLock l;
  Node *local_60;
  iterator local_50;
  AutoLock local_48;
  
  AutoLock::AutoLock(&local_48,&this->mLock);
  local_60 = ((this->mList).mHead)->next;
  if (local_60 == (this->mList).mTail) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    do {
      pLVar1 = local_60->val;
      if (pLVar1->mFd == fd) {
        pSVar2 = pLVar1->mListener;
        jVar3 = pLVar1->mPrivateData;
        if ((events & 0x30) == 0) {
          local_60 = local_60->next;
        }
        else {
          if ((events & 0x20) != 0) {
            jh_log_print(2,"bool Selector::callListeners(int, uint32_t)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Selector.cpp"
                         ,0x18a,"POLLNVAL recieved on fd = %d (%p)",fd,pLVar1);
          }
          if (local_60->val != (ListenerNode *)0x0) {
            operator_delete(local_60->val,0x18);
          }
          JetHead::list<Selector::ListenerNode_*>::iterator::erase(&local_50);
          local_60 = local_50.mNode;
          bVar4 = true;
        }
        if (pSVar2 != (SelectorListener *)0x0) {
          (**pSVar2->_vptr_SelectorListener)(pSVar2,fd,(ulong)(uint)(int)(short)events,jVar3);
        }
      }
      else {
        local_60 = local_60->next;
      }
    } while (local_60 != (this->mList).mTail);
  }
  AutoLock::~AutoLock(&local_48);
  return bVar4;
}

Assistant:

bool Selector::callListeners( int fd, uint32_t events )
{
	AutoLock l( mLock );
	TRACE_BEGIN( LOG_LVL_INFO );
	ListenerNode n( fd, NULL );
	bool result = false;
	
	JetHead::list<ListenerNode*>::iterator listener = mList.begin();
	while (listener != mList.end())
	{
		if (*(*listener) == n)
		{
			LOG( "got event %x %p", events, *listener );
		
			// We want to remove the listener from the list if 
			//  revents includes POLLHUP or POLLNVAL.  But we also
			//  need for the listener to know about these event(s).
			// A "good" listener could take care of this by 
			//  removing himself from the selector.  The lock has 
			//  been made recursive so this is possible without dead
			//  locking.  But a "bad" listener may ignore these 
			//  event entirly.  
			// So in the spirit of "doing the right thing".  We need
			//  to deal with both cases.  However once we 
			//  call the listener's callback, the listener itself
			//  might be destroyed.  But if POLLHUP or POLLNVAL
			//  was recieved and the listener has not been destroyed
			//  we must do it.
			
			// listener might be destroyed if POLLHUP or POLLNVAL
			//  events are recieved.  So we will get any data we 
			//  need from it now. 
			SelectorListener *interface = (*listener)->mListener;
			jh_ptr_int_t pd = (*listener)->mPrivateData;
		
			if ( events & ( POLLHUP | POLLNVAL ) )
			{	
				if ( events & POLLHUP )
					LOG_INFO( "POLLHUP recieved on fd = %d (%p)", fd, *listener );
				
				if ( events & POLLNVAL )
					LOG_WARN( "POLLNVAL recieved on fd = %d (%p)", fd, *listener );
								
				delete *listener;
				listener = listener.erase();

				result = true;
			}
			else
			{
				// Gets incremented by the "erase" in the other branch
				++listener;
			}
			
			if ( interface != NULL )
			{
				LOG_NOISE( "eventsCallback %p %d %d", interface, events, fd );
				interface->processFileEvents( fd, events, pd );
				LOG_NOISE( "eventsCallback done" );
			}
		} else {
			++listener;
		}
	}
	
	return result;
}